

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpBase::BeginModule
          (BinaryReaderObjdumpBase *this,uint32_t version)

{
  wabt *this_00;
  size_t sVar1;
  char *extraout_RDX;
  char *pcVar2;
  bool bVar3;
  string_view filename;
  string_view sVar4;
  long *local_38 [2];
  long local_28 [2];
  
  switch(this->options_->mode) {
  case Prepass:
    pcVar2 = this->options_->filename;
    this_00 = (wabt *)strlen(pcVar2);
    filename._M_str = extraout_RDX;
    filename._M_len = (size_t)pcVar2;
    sVar4 = GetBasename(this_00,filename);
    if (sVar4._M_len == 1) {
      bVar3 = *sVar4._M_str == '-';
      sVar1 = 1;
      if (bVar3) {
        sVar1 = 7;
      }
      sVar4._M_str = sVar4._M_str;
      sVar4._M_len = sVar1;
      if (bVar3) {
        sVar4._M_str = "<stdin>";
      }
    }
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,sVar4._M_str,sVar4._M_str + sVar4._M_len);
    printf("%s:\tfile format wasm %#x\n",local_38[0],version);
    if (local_38[0] == local_28) {
      return (Result)Ok;
    }
    operator_delete(local_38[0],local_28[0] + 1);
    return (Result)Ok;
  case Headers:
    putchar(10);
    pcVar2 = "Sections:\n";
    break;
  case Details:
    putchar(10);
    pcVar2 = "Section Details:\n";
    break;
  case Disassemble:
    putchar(10);
    pcVar2 = "Code Disassembly:\n";
    break;
  default:
    goto switchD_00111d40_default;
  }
  puts(pcVar2);
switchD_00111d40_default:
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpBase::BeginModule(uint32_t version) {
  switch (options_->mode) {
    case ObjdumpMode::Headers:
      printf("\n");
      printf("Sections:\n\n");
      break;
    case ObjdumpMode::Details:
      printf("\n");
      printf("Section Details:\n\n");
      break;
    case ObjdumpMode::Disassemble:
      printf("\n");
      printf("Code Disassembly:\n\n");
      break;
    case ObjdumpMode::Prepass: {
      std::string_view basename = GetBasename(options_->filename);
      if (basename == "-") {
        basename = "<stdin>";
      }
      printf("%s:\tfile format wasm %#x\n", std::string(basename).c_str(),
             version);
      break;
    }
    case ObjdumpMode::RawData:
      break;
  }

  return Result::Ok;
}